

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.cc
# Opt level: O3

char * OpenMesh::IO::OMFormat::as_string(Entity e)

{
  if ((e < (Entity_Halfedge|Entity_Mesh)) && ((0x57U >> (e & 0x1f) & 1) != 0)) {
    return &DAT_001a6170 + *(int *)(&DAT_001a6170 + (ulong)e * 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"as_string(Chunk::Entity): Invalid value!",0x28);
  return (char *)0x0;
}

Assistant:

const char *as_string(Chunk::Entity e)
  {
    switch(e)
    {    
      case Chunk::Entity_Vertex:   return "Vertex";
      case Chunk::Entity_Mesh:     return "Mesh";
      case Chunk::Entity_Edge:     return "Edge";
      case Chunk::Entity_Halfedge: return "Halfedge";
      case Chunk::Entity_Face:     return "Face";
      default:
	std::clog << "as_string(Chunk::Entity): Invalid value!";
    }
    return NULL;
  }